

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  double dVar1;
  double dVar2;
  double lhs;
  double rhs;
  BinopFunc<double,_double> *f_local;
  Thread *this_local;
  
  dVar1 = Pop<double>(this);
  dVar2 = Pop<double>(this);
  dVar1 = (*f)(dVar2,dVar1);
  Push<double>(this,dVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoBinop(BinopFunc<R, T> f) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  Push<R>(f(lhs, rhs));
  return RunResult::Ok;
}